

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

bool __thiscall
Rml::PropertySpecification::ParseShorthandDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,ShorthandId shorthand_id,
          String *property_value)

{
  int iVar1;
  PropertyDefinition *pPVar2;
  char *__s;
  code *pcVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  _func_int ***ppp_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  PropertyId id;
  ShorthandDefinition *pSVar9;
  size_type sVar10;
  reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  ShorthandItem *pSVar14;
  reference pSVar15;
  size_type sVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  undefined1 *puVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  undefined1 local_348 [8];
  Property new_property_2;
  size_t property_index;
  size_t value_index_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  const_iterator local_2d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  const_iterator local_2c0;
  const_reference local_2b8;
  ShorthandItem *item_3;
  String *subvalue;
  ulong uStack_2a0;
  bool result_2;
  size_t i_3;
  String temp_subvalue;
  size_t subvalue_i;
  ShorthandItem *item_2;
  const_iterator __end4;
  const_iterator __begin4;
  ShorthandItemList *__range4;
  size_t num_optional;
  ShorthandItem *item_1;
  size_t i_2;
  undefined1 local_230 [3];
  bool result_1;
  int value_index;
  Property new_property_1;
  int i_1;
  undefined1 auStack_1a8 [8];
  Array<int,_4> box_side_to_value_index;
  allocator<char> local_189;
  String local_188;
  const_reference local_168;
  value_type *item;
  int i;
  bool result;
  Property new_property;
  char *default_omitted_values [3];
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68;
  undefined1 local_58 [8];
  StringList property_values;
  SplitOption split_option;
  ShorthandDefinition *shorthand_definition;
  String *property_value_local;
  ShorthandId shorthand_id_local;
  PropertyDictionary *dictionary_local;
  PropertySpecification *this_local;
  
  pSVar9 = GetShorthand(this,shorthand_id);
  if (pSVar9 == (ShorthandDefinition *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_005fa32e;
  }
  property_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (pSVar9->type == RecursiveCommaSeparated) + Whitespace;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
  ParsePropertyValues(this,(StringList *)local_58,property_value,
                      property_values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  bVar8 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  if (bVar8) {
    this_local._7_1_ = 0;
    local_68._M_allocated_capacity._0_4_ = 1;
  }
  else {
    if ((pSVar9->type == Flex) &&
       (bVar8 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_58), !bVar8)) {
      sVar10 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                         (&pSVar9->items);
      if ((sVar10 != 3) &&
         (bVar8 = Assert("RMLUI_ASSERT(shorthand_definition->items.size() == 3)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                         ,0x118), !bVar8)) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pvVar11 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_58,0);
      bVar8 = ::std::operator==(pvVar11,"none");
      if (bVar8) {
        local_e0 = &local_d8;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"0",&local_e1);
        local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>(local_b8,"0",&local_e2);
        local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>(local_98,"auto",&local_e3);
        local_78 = &local_d8;
        local_70 = 3;
        __l._M_len = 3;
        __l._M_array = local_78;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,__l);
        local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
        do {
          local_398 = local_398 + -1;
          ::std::__cxx11::string::~string((string *)local_398);
        } while (local_398 != &local_d8);
        ::std::allocator<char>::~allocator(&local_e3);
        ::std::allocator<char>::~allocator(&local_e2);
        ::std::allocator<char>::~allocator(&local_e1);
      }
      else {
        new_property.source.
        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x70e3f1;
        Property::Property((Property *)&i);
        item._7_1_ = 1;
        for (item._0_4_ = 0; (int)item < 3; item._0_4_ = (int)item + 1) {
          local_168 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                      operator[](&pSVar9->items,(long)(int)item);
          pPVar2 = (local_168->field_4).property_definition;
          __s = default_omitted_values[(long)(int)item + -1];
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,__s,&local_189);
          bVar8 = PropertyDefinition::ParseValue(pPVar2,(Property *)&i,&local_188);
          item._7_1_ = bVar8 & item._7_1_;
          ::std::__cxx11::string::~string((string *)&local_188);
          ::std::allocator<char>::~allocator(&local_189);
          PropertyDictionary::SetProperty
                    (dictionary,(local_168->field_3).property_id,(Property *)&i);
        }
        if (((item._7_1_ & 1) == 0) &&
           (bVar8 = Assert("RMLUI_ASSERT(result)",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                           ,299), !bVar8)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        Property::~Property((Property *)&i);
      }
    }
    if ((pSVar9->type == Box) &&
       (sVar10 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_58), sVar10 < 4)) {
      auStack_1a8._0_4_ = 0;
      auStack_1a8._4_4_ = 0;
      box_side_to_value_index._M_elems[0] = 0;
      box_side_to_value_index._M_elems[1] = 0;
      sVar10 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58);
      if (sVar10 == 1) {
        auStack_1a8._0_4_ = 0;
        auStack_1a8._4_4_ = 0;
        box_side_to_value_index._M_elems[0] = 0;
        box_side_to_value_index._M_elems[1] = 0;
      }
      else if (sVar10 == 2) {
        auStack_1a8._0_4_ = 0;
        auStack_1a8._4_4_ = 1;
        box_side_to_value_index._M_elems[0] = 0;
        box_side_to_value_index._M_elems[1] = 1;
      }
      else if (sVar10 == 3) {
        auStack_1a8._0_4_ = 0;
        auStack_1a8._4_4_ = 1;
        box_side_to_value_index._M_elems[0] = 2;
        box_side_to_value_index._M_elems[1] = 1;
      }
      else {
        bVar8 = Assert("RMLUI_ERROR",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                       ,0x144);
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
      }
      for (new_property_1.source.
           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_ = 0;
          new_property_1.source.
          super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ < 4;
          new_property_1.source.
          super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = new_property_1.source.
                        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ + 1) {
        pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::operator[]
                            (&pSVar9->items,
                             (long)new_property_1.source.
                                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_);
        if ((pvVar12->type != Property) &&
           (bVar8 = Assert("RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property)"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                           ,0x149), !bVar8)) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        Property::Property((Property *)local_230);
        pvVar13 = ::std::array<int,_4UL>::operator[]
                            ((array<int,_4UL> *)auStack_1a8,
                             (long)new_property_1.source.
                                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_);
        iVar1 = *pvVar13;
        pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::operator[]
                            (&pSVar9->items,
                             (long)new_property_1.source.
                                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_);
        pPVar2 = (pvVar12->field_4).property_definition;
        pvVar11 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_58,(long)iVar1);
        bVar8 = PropertyDefinition::ParseValue(pPVar2,(Property *)local_230,pvVar11);
        if (bVar8) {
          pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                    operator[](&pSVar9->items,
                               (long)new_property_1.source.
                                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
          id = PropertyDefinition::GetId((pvVar12->field_4).property_definition);
          PropertyDictionary::SetProperty(dictionary,id,(Property *)local_230);
        }
        else {
          this_local._7_1_ = 0;
        }
        local_68._M_allocated_capacity._1_3_ = 0;
        local_68._M_local_buf[0] = !bVar8;
        Property::~Property((Property *)local_230);
        if (local_68._M_allocated_capacity._0_4_ != 0) goto LAB_005fa318;
      }
LAB_005fa30d:
      this_local._7_1_ = 1;
      local_68._M_allocated_capacity._0_4_ = 1;
    }
    else if (pSVar9->type == RecursiveRepeat) {
      i_2._3_1_ = true;
      for (item_1 = (ShorthandItem *)0x0;
          pSVar14 = (ShorthandItem *)
                    ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                              (&pSVar9->items), item_1 < pSVar14;
          item_1 = (ShorthandItem *)((long)&item_1->type + 1)) {
        pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::operator[]
                            (&pSVar9->items,(size_type)item_1);
        if (pvVar12->type == Property) {
          bVar8 = ParsePropertyDeclaration
                            (this,dictionary,(pvVar12->field_3).property_id,property_value);
          i_2._3_1_ = (i_2._3_1_ & bVar8) != 0;
        }
        else if (pvVar12->type == Shorthand) {
          bVar8 = ParseShorthandDeclaration
                            (this,dictionary,(pvVar12->field_3).shorthand_id,property_value);
          i_2._3_1_ = (i_2._3_1_ & bVar8) != 0;
        }
        else {
          i_2._3_1_ = false;
        }
      }
      if (i_2._3_1_ != false) goto LAB_005fa30d;
      this_local._7_1_ = 0;
      local_68._M_allocated_capacity._0_4_ = 1;
    }
    else if (pSVar9->type == RecursiveCommaSeparated) {
      __range4 = (ShorthandItemList *)0x0;
      __end4 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::begin
                         (&pSVar9->items);
      item_2 = (ShorthandItem *)
               ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::end
                         (&pSVar9->items);
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_Rml::ShorthandItem_*,_std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>_>
                                         *)&item_2), bVar8) {
        pSVar15 = __gnu_cxx::
                  __normal_iterator<const_Rml::ShorthandItem_*,_std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>_>
                  ::operator*(&__end4);
        if ((pSVar15->optional & 1U) != 0) {
          __range4 = (ShorthandItemList *)
                     ((long)&(__range4->
                             super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        }
        __gnu_cxx::
        __normal_iterator<const_Rml::ShorthandItem_*,_std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>_>
        ::operator++(&__end4);
      }
      sVar10 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58);
      sVar16 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                         (&pSVar9->items);
      if ((long)&(__range4->
                 super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar10 < sVar16) {
        this_local._7_1_ = 0;
        local_68._M_allocated_capacity._0_4_ = 1;
      }
      else {
        temp_subvalue.field_2._8_8_ = 0;
        ::std::__cxx11::string::string((string *)&i_3);
        uStack_2a0 = 0;
        while( true ) {
          uVar6 = uStack_2a0;
          sVar10 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                             (&pSVar9->items);
          uVar7 = temp_subvalue.field_2._8_8_;
          bVar8 = false;
          if (uVar6 < sVar10) {
            sVar10 = ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58);
            bVar8 = (ulong)uVar7 < sVar10;
          }
          if (!bVar8) break;
          subvalue._7_1_ = 0;
          item_3 = (ShorthandItem *)
                   ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,temp_subvalue.field_2._8_8_);
          local_2b8 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                      operator[](&pSVar9->items,uStack_2a0);
          if ((local_2b8->repeats & 1U) != 0) {
            local_2c8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_58);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_2c0,&local_2c8);
            local_2e0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_58);
            local_2d8 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator+(&local_2e0,temp_subvalue.field_2._8_8_);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_2d0,&local_2d8);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,local_2c0,local_2d0);
            ::std::__cxx11::string::clear();
            StringUtilities::JoinString((String *)&i_3,(StringList *)local_58,',');
            item_3 = (ShorthandItem *)&i_3;
          }
          if (local_2b8->type == Property) {
            subvalue._7_1_ =
                 ParsePropertyDeclaration
                           (this,dictionary,(local_2b8->field_3).property_id,(String *)item_3);
          }
          else if (local_2b8->type == Shorthand) {
            subvalue._7_1_ =
                 ParseShorthandDeclaration
                           (this,dictionary,(local_2b8->field_3).shorthand_id,(String *)item_3);
          }
          if ((subvalue._7_1_ & 1) == 0) {
            if (((local_2b8->repeats & 1U) != 0) || ((local_2b8->optional & 1U) == 0)) {
              this_local._7_1_ = 0;
              local_68._M_allocated_capacity._0_4_ = 1;
              goto LAB_005f9fbd;
            }
          }
          else {
            temp_subvalue.field_2._8_8_ = temp_subvalue.field_2._8_8_ + 1;
          }
          if ((local_2b8->repeats & 1U) != 0) break;
          uStack_2a0 = uStack_2a0 + 1;
        }
        local_68._M_allocated_capacity._0_4_ = 0;
LAB_005f9fbd:
        ::std::__cxx11::string::~string((string *)&i_3);
        if (local_68._M_allocated_capacity._0_4_ == 0) goto LAB_005fa30d;
      }
    }
    else {
      if ((((pSVar9->type != Box) && (pSVar9->type != FallThrough)) && (pSVar9->type != Replicate))
         && ((pSVar9->type != Flex &&
             (bVar8 = Assert("RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex)"
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                             ,0x193), !bVar8)))) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      sVar10 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58);
      sVar16 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                         (&pSVar9->items);
      if (sVar16 < sVar10) {
        this_local._7_1_ = 0;
        local_68._M_allocated_capacity._0_4_ = 1;
      }
      else {
        property_index = 0;
        new_property_2.source.
        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        while( true ) {
          sVar10 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_58);
          _Var5 = new_property_2.source.
                  super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          bVar8 = false;
          if (property_index < sVar10) {
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                                (&pSVar9->items);
            bVar8 = _Var5._M_pi < p_Var17;
          }
          if (!bVar8) break;
          Property::Property((Property *)local_348);
          pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                    operator[](&pSVar9->items,
                               (size_type)
                               new_property_2.source.
                               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
          pPVar2 = (pvVar12->field_4).property_definition;
          pvVar11 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_58,property_index);
          bVar8 = PropertyDefinition::ParseValue(pPVar2,(Property *)local_348,pvVar11);
          if (bVar8) {
            pvVar12 = ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                      operator[](&pSVar9->items,
                                 (size_type)
                                 new_property_2.source.
                                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
            PropertyDictionary::SetProperty
                      (dictionary,(pvVar12->field_3).property_id,(Property *)local_348);
            if ((pSVar9->type != Replicate) ||
               (sVar10 = ::std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58), property_index < sVar10 - 1)) {
              property_index = property_index + 1;
            }
            local_68._M_allocated_capacity._0_4_ = 0;
          }
          else if (((pSVar9->type == FallThrough) || (pSVar9->type == Flex)) &&
                  (ppp_Var4 = &(new_property_2.source.
                                super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base,
                  puVar18 = (undefined1 *)
                            ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::
                            size(&pSVar9->items), (undefined1 *)((long)ppp_Var4 + 1U) < puVar18)) {
            local_68._M_allocated_capacity._0_4_ = 0x13;
          }
          else {
            this_local._7_1_ = 0;
            local_68._M_allocated_capacity._0_4_ = 1;
          }
          Property::~Property((Property *)local_348);
          if ((local_68._M_allocated_capacity._0_4_ != 0) &&
             (local_68._M_allocated_capacity._0_4_ != 0x13)) goto LAB_005fa318;
          new_property_2.source.
          super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(new_property_2.source.
                           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
        }
        if (((pSVar9->type == Replicate) ||
            (sVar10 = ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_58),
            _Var5 = new_property_2.source.
                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount, sVar10 <= property_index)) ||
           (p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ::std::vector<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>::size
                                (&pSVar9->items), _Var5._M_pi < p_Var17)) goto LAB_005fa30d;
        this_local._7_1_ = 0;
        local_68._M_allocated_capacity._0_4_ = 1;
      }
    }
  }
LAB_005fa318:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
LAB_005fa32e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertySpecification::ParseShorthandDeclaration(PropertyDictionary& dictionary, ShorthandId shorthand_id, const String& property_value) const
{
	const ShorthandDefinition* shorthand_definition = GetShorthand(shorthand_id);
	if (!shorthand_definition)
		return false;

	const SplitOption split_option =
		(shorthand_definition->type == ShorthandType::RecursiveCommaSeparated ? SplitOption::Comma : SplitOption::Whitespace);

	StringList property_values;
	ParsePropertyValues(property_values, property_value, split_option);
	if (property_values.empty())
		return false;

	// Handle the special behavior of the flex shorthand first, otherwise it acts like 'FallThrough'.
	if (shorthand_definition->type == ShorthandType::Flex && !property_values.empty())
	{
		RMLUI_ASSERT(shorthand_definition->items.size() == 3);
		if (property_values[0] == "none")
		{
			property_values = {"0", "0", "auto"};
		}
		else
		{
			// Default values when omitted from the 'flex' shorthand is specified here. These defaults are special
			// for this shorthand only, otherwise each underlying property has a different default value.
			const char* default_omitted_values[] = {"1", "1", "0"}; // flex-grow, flex-shrink, flex-basis
			Property new_property;
			bool result = true;
			for (int i = 0; i < 3; i++)
			{
				auto& item = shorthand_definition->items[i];
				result &= item.property_definition->ParseValue(new_property, default_omitted_values[i]);
				dictionary.SetProperty(item.property_id, new_property);
			}
			(void)result;
			RMLUI_ASSERT(result);
		}
	}

	// If this definition is a 'box'-style shorthand (x-top x-right x-bottom x-left) that needs replication.
	if (shorthand_definition->type == ShorthandType::Box && property_values.size() < 4)
	{
		// This array tells which property index each side is parsed from
		Array<int, 4> box_side_to_value_index = {0, 0, 0, 0};
		switch (property_values.size())
		{
		case 1:
			// Only one value is defined, so it is parsed onto all four sides.
			box_side_to_value_index = {0, 0, 0, 0};
			break;
		case 2:
			// Two values are defined, so the first one is parsed onto the top and bottom value, the second onto
			// the left and right.
			box_side_to_value_index = {0, 1, 0, 1};
			break;
		case 3:
			// Three values are defined, so the first is parsed into the top value, the second onto the left and
			// right, and the third onto the bottom.
			box_side_to_value_index = {0, 1, 2, 1};
			break;
		default: RMLUI_ERROR; break;
		}

		for (int i = 0; i < 4; i++)
		{
			RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property);
			Property new_property;
			int value_index = box_side_to_value_index[i];
			if (!shorthand_definition->items[i].property_definition->ParseValue(new_property, property_values[value_index]))
				return false;

			dictionary.SetProperty(shorthand_definition->items[i].property_definition->GetId(), new_property);
		}
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveRepeat)
	{
		bool result = true;

		for (size_t i = 0; i < shorthand_definition->items.size(); i++)
		{
			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.type == ShorthandItemType::Property)
				result &= ParsePropertyDeclaration(dictionary, item.property_id, property_value);
			else if (item.type == ShorthandItemType::Shorthand)
				result &= ParseShorthandDeclaration(dictionary, item.shorthand_id, property_value);
			else
				result = false;
		}

		if (!result)
			return false;
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveCommaSeparated)
	{
		size_t num_optional = 0;
		for (auto& item : shorthand_definition->items)
			if (item.optional)
				num_optional += 1;

		if (property_values.size() + num_optional < shorthand_definition->items.size())
		{
			// Not enough subvalues declared.
			return false;
		}

		size_t subvalue_i = 0;
		String temp_subvalue;
		for (size_t i = 0; i < shorthand_definition->items.size() && subvalue_i < property_values.size(); i++)
		{
			bool result = false;

			const String* subvalue = &property_values[subvalue_i];

			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.repeats)
			{
				property_values.erase(property_values.begin(), property_values.begin() + subvalue_i);
				temp_subvalue.clear();
				StringUtilities::JoinString(temp_subvalue, property_values);
				subvalue = &temp_subvalue;
			}

			if (item.type == ShorthandItemType::Property)
				result = ParsePropertyDeclaration(dictionary, item.property_id, *subvalue);
			else if (item.type == ShorthandItemType::Shorthand)
				result = ParseShorthandDeclaration(dictionary, item.shorthand_id, *subvalue);

			if (result)
				subvalue_i += 1;
			else if (item.repeats || !item.optional)
				return false;

			if (item.repeats)
				break;
		}
	}
	else
	{
		RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough ||
			shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex);

		// Abort over-specified shorthand values.
		if (property_values.size() > shorthand_definition->items.size())
			return false;

		size_t value_index = 0;
		size_t property_index = 0;

		for (; value_index < property_values.size() && property_index < shorthand_definition->items.size(); property_index++)
		{
			Property new_property;

			if (!shorthand_definition->items[property_index].property_definition->ParseValue(new_property, property_values[value_index]))
			{
				// This definition failed to parse; if we're falling through, try the next property. If there is no
				// next property, then abort!
				if (shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Flex)
				{
					if (property_index + 1 < shorthand_definition->items.size())
						continue;
				}
				return false;
			}

			dictionary.SetProperty(shorthand_definition->items[property_index].property_id, new_property);

			// Increment the value index, unless we're replicating the last value and we're up to the last value.
			if (shorthand_definition->type != ShorthandType::Replicate || value_index < property_values.size() - 1)
				value_index++;
		}

		// Abort if we still have values left to parse but no more properties to pass them to.
		if (shorthand_definition->type != ShorthandType::Replicate && value_index < property_values.size() &&
			property_index >= shorthand_definition->items.size())
			return false;
	}

	return true;
}